

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::deviceProperties(TestStatus *__return_storage_ptr__,Context *context)

{
  undefined8 uVar1;
  bool bVar2;
  TestContext *this;
  TestLog *this_00;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  MessageBuilder *pMVar5;
  TestLog *this_01;
  size_t sVar6;
  ApiVersion AVar7;
  allocator<char> local_1059;
  string local_1058;
  allocator<char> local_1031;
  string local_1030;
  MessageBuilder local_1010;
  allocator<char> local_e89;
  string local_e88;
  MessageBuilder local_e68;
  ApiVersion local_ce8;
  undefined8 local_cd4;
  ApiVersion deqpVersion;
  deUint32 local_cc0;
  deUint32 local_cb8;
  uint uStack_cb4;
  ApiVersion deviceVersion;
  MessageBuilder local_c88;
  allocator<char> local_b01;
  string local_b00;
  MessageBuilder local_ae0;
  undefined8 local_960;
  undefined8 local_958;
  allocator<char> local_949;
  string local_948;
  MessageBuilder local_928;
  int local_7a8;
  allocator<char> local_7a1;
  int ndx;
  VkPhysicalDevice local_780 [3];
  MessageBuilder local_768;
  MessageBuilder local_5e8;
  undefined1 local_468 [8];
  deUint8 buffer [856];
  undefined1 local_104 [8];
  VkPhysicalDeviceFeatures features;
  VkPhysicalDeviceProperties *props;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  this_00 = tcu::TestContext::getLog(this);
  features._212_8_ = local_468;
  ::deMemset((void *)features._212_8_,0xcd,0x358);
  pIVar3 = Context::getInstanceInterface(context);
  pVVar4 = Context::getPhysicalDevice(context);
  (*pIVar3->_vptr_InstanceInterface[5])(pIVar3,pVVar4,features._212_8_);
  pIVar3 = Context::getInstanceInterface(context);
  pVVar4 = Context::getPhysicalDevice(context);
  (*pIVar3->_vptr_InstanceInterface[2])(pIVar3,pVVar4,local_104);
  tcu::TestLog::operator<<(&local_768,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_768,(char (*) [10])"device = ");
  local_780[0] = Context::getPhysicalDevice(context);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_780);
  this_01 = tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_5e8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_5e8,(VkPhysicalDeviceProperties *)features._212_8_);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5e8);
  tcu::MessageBuilder::~MessageBuilder(&local_768);
  bVar2 = validateFeatureLimits
                    ((VkPhysicalDeviceProperties *)features._212_8_,
                     (VkPhysicalDeviceFeatures *)local_104,this_00);
  if (bVar2) {
    for (local_7a8 = 0; local_7a8 < 0x20; local_7a8 = local_7a8 + 1) {
      if (buffer[(long)local_7a8 + 0x330] != 0xcd) {
        tcu::TestLog::operator<<(&local_928,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_928,(char (*) [33])"deviceProperties - Guard offset ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_7a8);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x12f598a);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_928);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_948,"deviceProperties buffer overflow",&local_949);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_948);
        std::__cxx11::string::~string((string *)&local_948);
        std::allocator<char>::~allocator(&local_949);
        return __return_storage_ptr__;
      }
    }
    pVVar4 = Context::getPhysicalDevice(context);
    pIVar3 = Context::getInstanceInterface(context);
    local_958 = 0;
    local_960 = 0x29;
    bVar2 = ::vk::ValidateQueryBits::
            validateInitComplete<vk::VkPhysicalDevice_s*,vk::InstanceInterface,vk::VkPhysicalDeviceProperties>
                      ((ValidateQueryBits *)pVVar4,(VkPhysicalDevice_s *)0x29,0,pIVar3,
                       (QueryMemberTableEntry *)
                       api::(anonymous_namespace)::s_physicalDevicePropertiesOffsetTable);
    if (bVar2) {
      sVar6 = deStrnlen((char *)(features._212_8_ + 0x14),0x100);
      if (sVar6 == 0x100) {
        tcu::TestLog::operator<<(&local_c88,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_c88,
                            (char (*) [82])
                            "deviceProperties - VkPhysicalDeviceProperties deviceName not properly initialized"
                           );
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_c88);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&deviceVersion.patchNum,"deviceProperties incomplete initialization",
                   (allocator<char> *)((long)&deviceVersion.minorNum + 3));
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&deviceVersion.patchNum);
        std::__cxx11::string::~string((string *)&deviceVersion.patchNum);
        std::allocator<char>::~allocator((allocator<char> *)((long)&deviceVersion.minorNum + 3));
      }
      else {
        AVar7 = ::vk::unpackVersion(*(deUint32 *)features._212_8_);
        local_cc0 = AVar7.patchNum;
        deviceVersion.majorNum = local_cc0;
        deqpVersion._4_8_ = AVar7._0_8_;
        local_cb8 = deqpVersion.minorNum;
        uStack_cb4 = deqpVersion.patchNum;
        unique0x100009ad = AVar7;
        AVar7 = ::vk::unpackVersion(0x400000);
        local_ce8._0_8_ = AVar7._0_8_;
        local_cd4._0_4_ = local_ce8.majorNum;
        local_cd4._4_4_ = local_ce8.minorNum;
        uVar1 = local_cd4;
        local_ce8.patchNum = AVar7.patchNum;
        deqpVersion.majorNum = local_ce8.patchNum;
        local_cd4._0_4_ = AVar7.majorNum;
        local_ce8 = AVar7;
        local_cd4 = uVar1;
        if (local_cb8 == (deUint32)local_cd4) {
          local_cd4._4_4_ = AVar7.minorNum;
          if (local_cd4._4_4_ < uStack_cb4) {
            tcu::TestLog::operator<<
                      (&local_1010,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (&local_1010,(char (*) [38])"deviceProperties - API Minor Version ");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&uStack_cb4);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (pMVar5,(char (*) [39])" is not valid for this version of dEQP");
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_1010);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1030,"deviceProperties apiVersion not valid",&local_1031);
            tcu::TestStatus::fail(__return_storage_ptr__,&local_1030);
            std::__cxx11::string::~string((string *)&local_1030);
            std::allocator<char>::~allocator(&local_1031);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1058,"DeviceProperites query succeeded",&local_1059);
            tcu::TestStatus::pass(__return_storage_ptr__,&local_1058);
            std::__cxx11::string::~string((string *)&local_1058);
            std::allocator<char>::~allocator(&local_1059);
          }
        }
        else {
          tcu::TestLog::operator<<(&local_e68,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_e68,(char (*) [38])"deviceProperties - API Major Version ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_cb8);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [14])" is not valid");
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_e68);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e88,"deviceProperties apiVersion not valid",&local_e89);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_e88);
          std::__cxx11::string::~string((string *)&local_e88);
          std::allocator<char>::~allocator(&local_e89);
        }
      }
    }
    else {
      tcu::TestLog::operator<<(&local_ae0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_ae0,
                          (char (*) [73])
                          "deviceProperties - VkPhysicalDeviceProperties not completely initialized"
                         );
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_ae0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b00,"deviceProperties incomplete initialization",&local_b01);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_b00);
      std::__cxx11::string::~string((string *)&local_b00);
      std::allocator<char>::~allocator(&local_b01);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ndx,"deviceProperties - feature limits failed",&local_7a1);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&ndx);
    std::__cxx11::string::~string((string *)&ndx);
    std::allocator<char>::~allocator(&local_7a1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceProperties (Context& context)
{
	using namespace ValidateQueryBits;

	TestLog&						log			= context.getTestContext().getLog();
	VkPhysicalDeviceProperties*		props;
	VkPhysicalDeviceFeatures		features;
	deUint8							buffer[sizeof(VkPhysicalDeviceProperties) + GUARD_SIZE];

	props = reinterpret_cast<VkPhysicalDeviceProperties*>(buffer);
	deMemset(props, GUARD_VALUE, sizeof(buffer));

	context.getInstanceInterface().getPhysicalDeviceProperties(context.getPhysicalDevice(), props);
	context.getInstanceInterface().getPhysicalDeviceFeatures(context.getPhysicalDevice(), &features);

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage
		<< TestLog::Message << *props << TestLog::EndMessage;

	if (!validateFeatureLimits(props, &features, log))
		return tcu::TestStatus::fail("deviceProperties - feature limits failed");

	for (int ndx = 0; ndx < GUARD_SIZE; ndx++)
	{
		if (buffer[ndx + sizeof(VkPhysicalDeviceProperties)] != GUARD_VALUE)
		{
			log << TestLog::Message << "deviceProperties - Guard offset " << ndx << " not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceProperties buffer overflow");
		}
	}

	if (!validateInitComplete(context.getPhysicalDevice(), &InstanceInterface::getPhysicalDeviceProperties, context.getInstanceInterface(), s_physicalDevicePropertiesOffsetTable))
	{
		log << TestLog::Message << "deviceProperties - VkPhysicalDeviceProperties not completely initialized" << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceProperties incomplete initialization");
	}

	// Check if deviceName string is properly terminated.
	if (deStrnlen(props->deviceName, VK_MAX_PHYSICAL_DEVICE_NAME_SIZE) == VK_MAX_PHYSICAL_DEVICE_NAME_SIZE)
	{
		log << TestLog::Message << "deviceProperties - VkPhysicalDeviceProperties deviceName not properly initialized" << TestLog::EndMessage;
		return tcu::TestStatus::fail("deviceProperties incomplete initialization");
	}

	{
		const ApiVersion deviceVersion = unpackVersion(props->apiVersion);
		const ApiVersion deqpVersion = unpackVersion(VK_API_VERSION);

		if (deviceVersion.majorNum != deqpVersion.majorNum)
		{
			log << TestLog::Message << "deviceProperties - API Major Version " << deviceVersion.majorNum << " is not valid" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceProperties apiVersion not valid");
		}

		if (deviceVersion.minorNum > deqpVersion.minorNum)
		{
			log << TestLog::Message << "deviceProperties - API Minor Version " << deviceVersion.minorNum << " is not valid for this version of dEQP" << TestLog::EndMessage;
			return tcu::TestStatus::fail("deviceProperties apiVersion not valid");
		}
	}

	return tcu::TestStatus::pass("DeviceProperites query succeeded");
}